

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qfontcombobox.cpp
# Opt level: O2

void QFontComboBox::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  WritingSystem *pWVar1;
  undefined8 uVar2;
  WritingSystem WVar3;
  QFont *font;
  long in_FS_OFFSET;
  undefined8 local_28;
  WritingSystem local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    if (_id == 1) {
      font = (QFont *)_a[1];
LAB_003dc4e8:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setCurrentFont((QFontComboBox *)_o,font);
        return;
      }
      goto LAB_003dc583;
    }
    if (_id == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        currentFontChanged((QFontComboBox *)_o,(QFont *)_a[1]);
        return;
      }
      goto LAB_003dc583;
    }
    break;
  case ReadProperty:
    pWVar1 = (WritingSystem *)*_a;
    if (_id == 2) {
      currentFont((QFontComboBox *)&local_28);
      uVar2 = *(undefined8 *)pWVar1;
      *(undefined8 *)pWVar1 = local_28;
      WVar3 = pWVar1[2];
      pWVar1[2] = local_20;
      local_28 = uVar2;
      local_20 = WVar3;
      QFont::~QFont((QFont *)&local_28);
    }
    else {
      if (_id == 1) {
        WVar3 = *(WritingSystem *)(*(long *)(_o + 8) + 0x350);
      }
      else {
        if (_id != 0) break;
        WVar3 = writingSystem((QFontComboBox *)_o);
      }
      *pWVar1 = WVar3;
    }
    break;
  case WriteProperty:
    font = (QFont *)*_a;
    if (_id == 2) goto LAB_003dc4e8;
    if (_id == 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setFontFilters((QFontComboBox *)_o,(FontFilters)*(Int *)font);
        return;
      }
      goto LAB_003dc583;
    }
    if (_id == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setWritingSystem((QFontComboBox *)_o,*(Int *)font);
        return;
      }
      goto LAB_003dc583;
    }
    break;
  case IndexOfMethod:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QtMocHelpers::indexOfMethod<void(QFontComboBox::*)(QFont_const&)>
                ((QtMocHelpers *)_a,(void **)currentFontChanged,0,0);
      return;
    }
    goto LAB_003dc583;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_003dc583:
  __stack_chk_fail();
}

Assistant:

void QFontComboBox::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QFontComboBox *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->currentFontChanged((*reinterpret_cast< std::add_pointer_t<QFont>>(_a[1]))); break;
        case 1: _t->setCurrentFont((*reinterpret_cast< std::add_pointer_t<QFont>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QFontComboBox::*)(const QFont & )>(_a, &QFontComboBox::currentFontChanged, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QFontDatabase::WritingSystem*>(_v) = _t->writingSystem(); break;
        case 1: QtMocHelpers::assignFlags<FontFilters>(_v, _t->fontFilters()); break;
        case 2: *reinterpret_cast<QFont*>(_v) = _t->currentFont(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setWritingSystem(*reinterpret_cast<QFontDatabase::WritingSystem*>(_v)); break;
        case 1: _t->setFontFilters(*reinterpret_cast<FontFilters*>(_v)); break;
        case 2: _t->setCurrentFont(*reinterpret_cast<QFont*>(_v)); break;
        default: break;
        }
    }
}